

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralString.cpp
# Opt level: O0

void __thiscall
Js::LiteralString::LiteralString
          (LiteralString *this,StaticType *type,char16 *content,charcount_t charLength)

{
  ScriptContext *scriptContext;
  charcount_t charLength_local;
  char16 *content_local;
  StaticType *type_local;
  LiteralString *this_local;
  
  JavascriptString::JavascriptString(&this->super_JavascriptString,type,charLength,content);
  (this->super_JavascriptString).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01df4cd0;
  scriptContext = Js::Type::GetScriptContext(&type->super_Type);
  StringProfiler::RecordNewString(scriptContext,content,charLength);
  return;
}

Assistant:

LiteralString::LiteralString(StaticType * type, const char16* content, charcount_t charLength) :
        JavascriptString(type, charLength, content)
    {
#if defined(DBG) && defined(_M_IX86)
        // Make sure content isn't on the stack by comparing to stack bounds in TIB
        AssertMsg(!ThreadContext::IsOnStack((void*)content),
            "LiteralString object created using stack buffer...");
#endif
#if SYSINFO_IMAGE_BASE_AVAILABLE
       AssertMsg(AutoSystemInfo::IsJscriptModulePointer((void *)content)
           || type->GetScriptContext()->GetRecycler()->IsValidObject((void *)content),
           "LiteralString can only be used with static or GC strings");
#endif

#ifdef PROFILE_STRINGS
        StringProfiler::RecordNewString( type->GetScriptContext(), content, charLength );
#endif
    }